

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O1

void test_read_until_no_buffered_stream(void)

{
  int iVar1;
  cio_error cVar2;
  memory_stream *ms;
  uint8_t buffer [40];
  cio_read_buffer rb;
  uint8_t auStack_68 [40];
  uint8_t local_40 [8];
  cio_read_buffer local_38;
  
  ms = (memory_stream *)malloc(0x100);
  iVar1 = memory_stream_init(ms,"MYHelloWorldExample");
  UnityAssertEqualNumber
            (0,(long)iVar1,"Could not allocate memory for test!",0x458,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_max;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer;
  local_38.end = local_40;
  local_38.data = auStack_68;
  local_38.add_ptr = auStack_68;
  local_38.fetch_ptr = auStack_68;
  UnityAssertEqualNumber
            (0,0,"Read buffer was not initialized correctly!",0x45f,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Buffer was not initialized correctly!",0x462,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_read_until
                    ((cio_buffered_stream *)0x0,&local_38,"HelloWorld",dummy_read_handler,
                     first_check_buffer);
  UnityAssertEqualNumber
            (-0x16,(long)cVar2,"Return value not correct!",0x465,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x466,
             UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_buffered_stream_close((cio_buffered_stream *)(ms + 1));
  UnityAssertEqualNumber(0,(long)cVar2,"Return value not correct!",0x469,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x46a,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_read_until_no_buffered_stream(void)
{
#define PRE_DELIM "MY"
#define DELIM "HelloWorld"
	struct client *client = malloc(sizeof(*client));

	static const char *test_data = PRE_DELIM DELIM "Example";
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_max;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer;

	uint8_t buffer[40];
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, &buffer, sizeof(buffer));
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");

	err = cio_buffered_stream_read_until(NULL, &rb, DELIM, dummy_read_handler, first_check_buffer);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(0, dummy_read_handler_fake.call_count, "Handler was not called!");

	err = cio_buffered_stream_close(&client->bs);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
}